

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

size_t __thiscall
gmlc::utilities::base64_decode
          (utilities *this,string_view encoded_string,void *data,size_t max_size)

{
  void *pvVar1;
  char cVar2;
  undefined4 uVar3;
  void *pvVar4;
  char *pcVar5;
  byte bVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  void *pvVar14;
  byte local_30 [5];
  byte local_2b [3];
  array<unsigned_char,_4UL> char_array_4;
  
  pcVar5 = encoded_string._M_str;
  local_30[0] = 0;
  local_30[1] = 0;
  local_30[2] = 0;
  local_30[3] = 0;
  lVar11 = 0;
  pvVar4 = (void *)0x0;
  do {
    lVar12 = -(long)this;
    pvVar14 = (void *)((long)pvVar4 + 2);
    pvVar1 = (void *)((long)pvVar4 + 1);
    uVar9 = 0;
LAB_00330bb5:
    do {
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 1;
      if (lVar12 == 1) {
LAB_00330c8a:
        if ((int)uVar9 < 1) {
          return (size_t)pvVar4;
        }
        pbVar7 = local_30 + uVar9;
        for (uVar10 = uVar9; (int)uVar10 < 4; uVar10 = uVar10 + 1) {
          *pbVar7 = 0;
          pbVar7 = pbVar7 + 1;
        }
        local_2b[0] = (byte)b64Map[local_30[1]] >> 4 & 3 | b64Map[local_30[0]] << 2;
        local_2b[1] = (byte)b64Map[local_30[2]] >> 2 & 0xf | b64Map[local_30[1]] << 4;
        local_2b[2] = b64Map[local_30[2]] * '@' + b64Map[local_30[3]];
        for (uVar8 = 0; uVar9 - 1 != uVar8; uVar8 = uVar8 + 1) {
          if (pvVar4 < data) {
            pcVar5[(long)pvVar4] = local_2b[uVar8];
            pvVar4 = (void *)((long)pvVar4 + 1);
          }
        }
        return (size_t)pvVar4;
      }
      bVar6 = *(byte *)((encoded_string._M_len - 1) + lVar11);
      if (((ulong)bVar6 == 0x3d) || (b64Map[bVar6] == -1)) goto LAB_00330c8a;
      lVar13 = (long)(int)uVar9;
      uVar9 = uVar9 + 1;
      local_30[lVar13] = bVar6;
      uVar3 = local_30._0_4_;
    } while (uVar9 != 4);
    cVar2 = b64Map[local_30[0]];
    local_30[1] = b64Map[local_30[1]];
    local_30[0] = cVar2;
    local_30[2] = SUB41(uVar3,2);
    local_30[2] = b64Map[local_30[2]];
    local_30[3] = SUB41(uVar3,3);
    local_30[3] = b64Map[local_30[3]];
    if (data <= pvVar14) {
      if (pvVar1 < data) {
        bVar6 = local_30[2] >> 2 & 0xf | local_30[1] << 4;
        pcVar5[(long)pvVar4] = local_30[1] >> 4 & 3 | cVar2 << 2;
        pvVar4 = pvVar1;
      }
      else {
        uVar9 = 0;
        if (data <= pvVar4) goto LAB_00330bb5;
        bVar6 = local_30[1] >> 4 & 3 | cVar2 << 2;
        pvVar14 = pvVar1;
      }
      pcVar5[(long)pvVar4] = bVar6;
      return (size_t)pvVar14;
    }
    pcVar5[(long)pvVar4] = local_30[1] >> 4 & 3 | cVar2 << 2;
    (pcVar5 + 1)[(long)pvVar4] = local_30[2] >> 2 & 0xf | local_30[1] << 4;
    (pcVar5 + 2)[(long)pvVar4] = local_30[3] + local_30[2] * '@';
    pvVar4 = (void *)((long)pvVar4 + 3);
    this = (utilities *)-lVar12;
  } while( true );
}

Assistant:

size_t
    base64_decode(std::string_view encoded_string, void* data, size_t max_size)
{
    auto in_len = encoded_string.size();
    int indexOut = 0;
    int indexIn = 0;
    std::array<unsigned char, 3> char_array_3{{'\0', '\0', '\0'}};
    std::array<unsigned char, 4> char_array_4{{'\0', '\0', '\0', '\0'}};
    auto* outData = static_cast<unsigned char*>(data);
    size_t dataIndex = 0U;
    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];
            if (dataIndex + 2 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                outData[dataIndex++] = char_array_3[2];
            } else if (dataIndex + 1 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                return dataIndex;
            } else if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[0];
                return dataIndex;
            }

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[j];
            }
        }
    }
    return dataIndex;
}